

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O0

Unique<Entry<BrepTrim>_> __thiscall
anurbs::Entry<anurbs::BrepTrim>::create
          (Entry<anurbs::BrepTrim> *this,shared_ptr<anurbs::BrepTrim> *data)

{
  unique_ptr<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_> local_30;
  undefined1 local_28 [8];
  Pointer<Attributes> attributes;
  shared_ptr<anurbs::BrepTrim> *data_local;
  
  attributes.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)data;
  new_<anurbs::Attributes>();
  std::shared_ptr<anurbs::Attributes>::
  shared_ptr<anurbs::Attributes,std::default_delete<anurbs::Attributes>,void>
            ((shared_ptr<anurbs::Attributes> *)local_28,&local_30);
  std::unique_ptr<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_>::~unique_ptr
            (&local_30);
  new_<anurbs::Entry<anurbs::BrepTrim>,std::shared_ptr<anurbs::BrepTrim>&,std::shared_ptr<anurbs::Attributes>&>
            ((anurbs *)this,data,(shared_ptr<anurbs::Attributes> *)local_28);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr((shared_ptr<anurbs::Attributes> *)local_28);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::BrepTrim>,_std::default_delete<anurbs::Entry<anurbs::BrepTrim>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::BrepTrim>,_std::default_delete<anurbs::Entry<anurbs::BrepTrim>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Entry<TData>> create(std::shared_ptr<TData> data)
    {
        Pointer<Attributes> attributes = new_<Attributes>();
        return new_<Entry<TData>>(data, attributes);
    }